

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O1

bool __thiscall
GNUmakeTokenPool::Setup(GNUmakeTokenPool *this,bool ignore,bool verbose,double *max_load_average)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  char *pcVar3;
  int load_limit;
  LinePrinter printer;
  int local_a4;
  string local_a0;
  LinePrinter local_80;
  
  iVar1 = (*(this->super_TokenPool)._vptr_TokenPool[8])(this,"MAKEFLAGS");
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar3 != (char *)0x0) {
    pcVar2 = strstr(pcVar3,"--jobserver-fds=");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(pcVar3,"--jobserver-auth=");
    }
    if (pcVar2 != (char *)0x0) {
      LinePrinter::LinePrinter(&local_80);
      if (ignore) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   "ninja: warning: -jN forced on command line; ignoring GNU make jobserver.\n","");
        LinePrinter::PrintOnNewLine(&local_80,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar1 = (*(this->super_TokenPool)._vptr_TokenPool[9])(this,pcVar2);
        if ((char)iVar1 != '\0') {
          pcVar3 = strstr(pcVar3," -l");
          local_a4 = -1;
          if (verbose) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"ninja: using GNU make jobserver.\n","");
            LinePrinter::PrintOnNewLine(&local_80,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((pcVar3 != (char *)0x0) &&
             (iVar1 = __isoc99_sscanf(pcVar3 + 3,"%d ",&local_a4), 0 < local_a4 && iVar1 == 1)) {
            *max_load_average = (double)local_a4;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.output_buffer_._M_dataplus._M_p != &local_80.output_buffer_.field_2) {
            operator_delete(local_80.output_buffer_._M_dataplus._M_p,
                            local_80.output_buffer_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.line_buffer_._M_dataplus._M_p != &local_80.line_buffer_.field_2) {
            operator_delete(local_80.line_buffer_._M_dataplus._M_p,
                            local_80.line_buffer_.field_2._M_allocated_capacity + 1);
          }
          return true;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.output_buffer_._M_dataplus._M_p != &local_80.output_buffer_.field_2) {
        operator_delete(local_80.output_buffer_._M_dataplus._M_p,
                        local_80.output_buffer_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.line_buffer_._M_dataplus._M_p != &local_80.line_buffer_.field_2) {
        operator_delete(local_80.line_buffer_._M_dataplus._M_p,
                        local_80.line_buffer_.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GNUmakeTokenPool::Setup(bool ignore,
                             bool verbose,
                             double& max_load_average) {
  const char* value = GetEnv("MAKEFLAGS");
  if (!value)
    return false;

  // GNU make <= 4.1
  const char* jobserver = strstr(value, "--jobserver-fds=");
  if (!jobserver)
    // GNU make => 4.2
    jobserver = strstr(value, "--jobserver-auth=");
  if (jobserver) {
    LinePrinter printer;

    if (ignore) {
      printer.PrintOnNewLine("ninja: warning: -jN forced on command line; ignoring GNU make jobserver.\n");
    } else {
      if (ParseAuth(jobserver)) {
        const char* l_arg = strstr(value, " -l");
        int load_limit = -1;

        if (verbose) {
          printer.PrintOnNewLine("ninja: using GNU make jobserver.\n");
        }

        // translate GNU make -lN to ninja -lN
        if (l_arg &&
            (sscanf(l_arg + 3, "%d ", &load_limit) == 1) &&
            (load_limit > 0)) {
          max_load_average = load_limit;
        }

        return true;
      }
    }
  }

  return false;
}